

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

void SetPlane(uint8_t *dst_y,int dst_stride_y,int width,int height,uint32_t value)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  code *pcVar4;
  int iVar5;
  bool bVar6;
  
  iVar1 = height;
  if (height < 0) {
    iVar1 = -height;
    dst_y = dst_y + ~height * dst_stride_y;
    dst_stride_y = -dst_stride_y;
  }
  bVar6 = dst_stride_y != width;
  iVar3 = 0;
  if (bVar6) {
    iVar3 = dst_stride_y;
  }
  iVar5 = 1;
  if (!bVar6) {
    iVar5 = iVar1;
  }
  if (!bVar6) {
    iVar1 = 1;
  }
  uVar2 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar2 = InitCpuFlags();
  }
  if ((iVar5 * width & 3U) == 0) {
    pcVar4 = SetRow_X86;
  }
  else {
    pcVar4 = SetRow_Any_X86;
  }
  if ((uVar2 & 0x10) == 0) {
    pcVar4 = SetRow_C;
  }
  uVar2 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar2 = InitCpuFlags();
  }
  if ((uVar2 >> 0xb & 1) != 0) {
    pcVar4 = SetRow_ERMS;
  }
  if (iVar1 != 0) {
    do {
      (*pcVar4)(dst_y,value & 0xff,iVar5 * width);
      dst_y = dst_y + iVar3;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

LIBYUV_API
void SetPlane(uint8_t* dst_y,
              int dst_stride_y,
              int width,
              int height,
              uint32_t value) {
  int y;
  void (*SetRow)(uint8_t * dst, uint8_t value, int width) = SetRow_C;
  if (height < 0) {
    height = -height;
    dst_y = dst_y + (height - 1) * dst_stride_y;
    dst_stride_y = -dst_stride_y;
  }
  // Coalesce rows.
  if (dst_stride_y == width) {
    width *= height;
    height = 1;
    dst_stride_y = 0;
  }
#if defined(HAS_SETROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SetRow = SetRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      SetRow = SetRow_NEON;
    }
  }
#endif
#if defined(HAS_SETROW_X86)
  if (TestCpuFlag(kCpuHasX86)) {
    SetRow = SetRow_Any_X86;
    if (IS_ALIGNED(width, 4)) {
      SetRow = SetRow_X86;
    }
  }
#endif
#if defined(HAS_SETROW_ERMS)
  if (TestCpuFlag(kCpuHasERMS)) {
    SetRow = SetRow_ERMS;
  }
#endif
#if defined(HAS_SETROW_MSA)
  if (TestCpuFlag(kCpuHasMSA) && IS_ALIGNED(width, 16)) {
    SetRow = SetRow_MSA;
  }
#endif

  // Set plane
  for (y = 0; y < height; ++y) {
    SetRow(dst_y, value, width);
    dst_y += dst_stride_y;
  }
}